

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gls::TextureStateQueryTests::anon_unknown_1::RequiredExtensions::check
          (RequiredExtensions *this,ContextInfo *ctxInfo)

{
  char *__s;
  bool bVar1;
  pointer ppcVar2;
  size_t sVar3;
  NotSupportedError *this_00;
  char **__args;
  long lVar4;
  long lVar5;
  vector<const_char_*,_std::allocator<const_char_*>_> failedExtensions;
  ostringstream buf;
  char **local_1e8;
  iterator iStack_1e0;
  char **local_1d8;
  string local_1c8;
  long local_1a8 [47];
  
  local_1e8 = (char **)0x0;
  iStack_1e0._M_current = (char **)0x0;
  local_1d8 = (char **)0x0;
  ppcVar2 = (this->m_extensions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->m_extensions).
                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)ppcVar2) >> 3)) {
    lVar4 = 0;
    lVar5 = 0;
    do {
      bVar1 = glu::ContextInfo::isExtensionSupported(ctxInfo,*(char **)((long)ppcVar2 + lVar4));
      if (!bVar1) {
        __args = (char **)((long)(this->m_extensions).
                                 super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start + lVar4);
        if (iStack_1e0._M_current == local_1d8) {
          std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*const&>
                    ((vector<char_const*,std::allocator<char_const*>> *)&local_1e8,iStack_1e0,__args
                    );
        }
        else {
          *iStack_1e0._M_current = *__args;
          iStack_1e0._M_current = iStack_1e0._M_current + 1;
        }
      }
      lVar5 = lVar5 + 1;
      ppcVar2 = (this->m_extensions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 8;
    } while (lVar5 < (int)((ulong)((long)(this->m_extensions).
                                         super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppcVar2)
                          >> 3));
  }
  if (local_1e8 == iStack_1e0._M_current) {
    if (local_1e8 != (char **)0x0) {
      operator_delete(local_1e8,(long)local_1d8 - (long)local_1e8);
    }
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Test requires extension: ",0x19);
  if (0 < (int)((ulong)((long)iStack_1e0._M_current - (long)local_1e8) >> 3)) {
    lVar4 = 0;
    do {
      if (lVar4 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
      }
      __s = local_1e8[lVar4];
      if (__s == (char *)0x0) {
        std::ios::clear((int)&local_1e8 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x40);
      }
      else {
        sVar3 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar3);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < (int)((ulong)((long)iStack_1e0._M_current - (long)local_1e8) >> 3));
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  tcu::NotSupportedError::NotSupportedError(this_00,&local_1c8);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

static bool isPureIntTester (TesterType tester)
{
#define HANDLE_ALL_SETTERS(X) \
		case X: \
		case X ## _SET_PURE_UINT: return false; \
		case X ## _SET_PURE_INT: return true;

	switch (tester)
	{
		HANDLE_ALL_SETTERS(TESTER_TEXTURE_SWIZZLE_R)
		HANDLE_ALL_SETTERS(TESTER_TEXTURE_SWIZZLE_G)
		HANDLE_ALL_SETTERS(TESTER_TEXTURE_SWIZZLE_B)
		HANDLE_ALL_SETTERS(TESTER_TEXTURE_SWIZZLE_A)
		HANDLE_ALL_SETTERS(TESTER_TEXTURE_WRAP_S)
		HANDLE_ALL_SETTERS(TESTER_TEXTURE_WRAP_T)
		HANDLE_ALL_SETTERS(TESTER_TEXTURE_WRAP_R)
		HANDLE_ALL_SETTERS(TESTER_TEXTURE_MAG_FILTER)
		HANDLE_ALL_SETTERS(TESTER_TEXTURE_MIN_FILTER)
		HANDLE_ALL_SETTERS(TESTER_TEXTURE_MIN_LOD)
		HANDLE_ALL_SETTERS(TESTER_TEXTURE_MAX_LOD)
		HANDLE_ALL_SETTERS(TESTER_TEXTURE_BASE_LEVEL)
		HANDLE_ALL_SETTERS(TESTER_TEXTURE_MAX_LEVEL)
		HANDLE_ALL_SETTERS(TESTER_TEXTURE_COMPARE_MODE)
		HANDLE_ALL_SETTERS(TESTER_TEXTURE_COMPARE_FUNC)
		HANDLE_ALL_SETTERS(TESTER_DEPTH_STENCIL_TEXTURE_MODE)
		HANDLE_ALL_SETTERS(TESTER_TEXTURE_SRGB_DECODE_EXT)

		case TESTER_TEXTURE_IMMUTABLE_LEVELS:
		case TESTER_TEXTURE_IMMUTABLE_FORMAT:
		case TESTER_TEXTURE_WRAP_S_CLAMP_TO_BORDER:
		case TESTER_TEXTURE_WRAP_T_CLAMP_TO_BORDER:
		case TESTER_TEXTURE_WRAP_R_CLAMP_TO_BORDER:
		case TESTER_TEXTURE_BORDER_COLOR:
			return false;

		default:
			DE_ASSERT(false);
			return false;
	}

#undef HANDLE_ALL_SETTERS
}